

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

SinhLayerParams * __thiscall
CoreML::Specification::SinhLayerParams::New(SinhLayerParams *this,Arena *arena)

{
  SinhLayerParams *this_00;
  
  this_00 = (SinhLayerParams *)operator_new(0x18);
  SinhLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SinhLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

SinhLayerParams* SinhLayerParams::New(::google::protobuf::Arena* arena) const {
  SinhLayerParams* n = new SinhLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}